

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O0

void __thiscall
tchecker::parsing::clock_declaration_t::~clock_declaration_t(clock_declaration_t *this)

{
  clock_declaration_t *this_local;
  
  ~clock_declaration_t(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

clock_declaration_t::~clock_declaration_t() = default;